

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moment_suite.cpp
# Opt level: O0

void mean_double_suite::test_linear_increase_from_offset(void)

{
  undefined8 local_b8;
  value_type local_b0 [2];
  undefined8 local_a0;
  value_type local_98 [2];
  undefined8 local_88;
  value_type local_80 [2];
  undefined8 local_70;
  value_type local_68 [2];
  undefined8 local_58;
  value_type local_50 [2];
  undefined8 local_40;
  value_type local_38 [2];
  undefined1 local_28 [8];
  moment<double,_4> filter;
  
  trial::online::interim::basic_moment<double,_4UL,_(trial::online::with)1>::basic_moment
            ((basic_moment<double,_4UL,_(trial::online::with)1> *)local_28);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *)local_28,
             10.0);
  local_38[0] = trial::online::interim::detail::
                basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::mean
                          ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>
                            *)local_28);
  local_40 = 0x4024000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","10.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xb5,"void mean_double_suite::test_linear_increase_from_offset()",local_38,&local_40);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *)local_28,
             11.0);
  local_50[0] = trial::online::interim::detail::
                basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::mean
                          ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>
                            *)local_28);
  local_58 = 0x4025000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","10.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xb7,"void mean_double_suite::test_linear_increase_from_offset()",local_50,&local_58);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *)local_28,
             12.0);
  local_68[0] = trial::online::interim::detail::
                basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::mean
                          ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>
                            *)local_28);
  local_70 = 0x4026000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","11.0",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xb9,"void mean_double_suite::test_linear_increase_from_offset()",local_68,&local_70);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *)local_28,
             13.0);
  local_80[0] = trial::online::interim::detail::
                basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::mean
                          ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>
                            *)local_28);
  local_88 = 0x4027000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","11.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xbb,"void mean_double_suite::test_linear_increase_from_offset()",local_80,&local_88);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *)local_28,
             14.0);
  local_98[0] = trial::online::interim::detail::
                basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::mean
                          ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>
                            *)local_28);
  local_a0 = 0x4029000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","12.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xbd,"void mean_double_suite::test_linear_increase_from_offset()",local_98,&local_a0);
  trial::online::interim::detail::
  basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::push
            ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1> *)local_28,
             15.0);
  local_b0[0] = trial::online::interim::detail::
                basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>::mean
                          ((basic_moment<double,_4UL,_(trial::online::with)1,_(trial::online::with)1>
                            *)local_28);
  local_b8 = 0x402b000000000000;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,double,double>
            ("filter.mean()","13.5",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]trial/test/interim/moment_suite.cpp"
             ,0xbf,"void mean_double_suite::test_linear_increase_from_offset()",local_b0,&local_b8);
  return;
}

Assistant:

void test_linear_increase_from_offset()
{
    interim::moment<double, 4> filter;
    filter.push(10.0);
    TRIAL_TEST_EQ(filter.mean(), 10.0);
    filter.push(11.0);
    TRIAL_TEST_EQ(filter.mean(), 10.5);
    filter.push(12.0);
    TRIAL_TEST_EQ(filter.mean(), 11.0);
    filter.push(13.0);
    TRIAL_TEST_EQ(filter.mean(), 11.5);
    filter.push(14.0);
    TRIAL_TEST_EQ(filter.mean(), 12.5);
    filter.push(15.0);
    TRIAL_TEST_EQ(filter.mean(), 13.5);
}